

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * QLocale::territoryToCode(Territory territory)

{
  QString *in_RDI;
  QLatin1StringView QVar1;
  QLatin1StringView in_stack_00000000;
  
  QVar1 = QLocalePrivate::territoryToCode((Territory)((ulong)in_RDI >> 0x30));
  QString::QString((QString *)QVar1.m_size,in_stack_00000000);
  return in_RDI;
}

Assistant:

QString QLocale::territoryToCode(QLocale::Territory territory)
{
    return QLocalePrivate::territoryToCode(territory);
}